

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jquant2.c
# Opt level: O1

void update_box(j_decompress_ptr cinfo,boxptr boxp)

{
  _func_void_j_decompress_ptr *p_Var1;
  bool bVar2;
  int iVar3;
  long lVar4;
  short *psVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  
  p_Var1 = cinfo->cquantize[1].finish_pass;
  iVar14 = boxp->c0min;
  iVar15 = boxp->c0max;
  iVar3 = boxp->c1min;
  lVar4 = (long)iVar3;
  iVar7 = boxp->c1max;
  iVar10 = boxp->c2min;
  lVar11 = (long)iVar10;
  iVar8 = boxp->c2max;
  if (iVar14 < iVar15) {
    lVar16 = (long)iVar14;
    do {
      if (iVar3 <= iVar7) {
        lVar6 = *(long *)(p_Var1 + lVar16 * 8) + lVar4 * 0x40 + lVar11 * 2;
        lVar13 = lVar4;
        do {
          if (iVar10 <= iVar8) {
            lVar9 = 0;
            do {
              if (*(short *)(lVar6 + lVar9 * 2) != 0) {
                iVar14 = (int)lVar16;
                boxp->c0min = iVar14;
                goto LAB_00280aba;
              }
              lVar9 = lVar9 + 1;
            } while ((iVar8 - iVar10) + 1 != (int)lVar9);
          }
          lVar13 = lVar13 + 1;
          lVar6 = lVar6 + 0x40;
        } while (iVar7 + 1 != (int)lVar13);
      }
      lVar16 = lVar16 + 1;
    } while (iVar15 + 1 != (int)lVar16);
  }
LAB_00280aba:
  if (iVar14 < iVar15) {
    lVar16 = (long)iVar15;
    do {
      if (iVar3 <= iVar7) {
        lVar6 = *(long *)(p_Var1 + lVar16 * 8) + lVar4 * 0x40 + lVar11 * 2;
        lVar13 = lVar4;
        do {
          if (iVar10 <= iVar8) {
            lVar9 = 0;
            do {
              if (*(short *)(lVar6 + lVar9 * 2) != 0) {
                iVar15 = (int)lVar16;
                boxp->c0max = iVar15;
                goto LAB_00280b43;
              }
              lVar9 = lVar9 + 1;
            } while ((iVar8 - iVar10) + 1 != (int)lVar9);
          }
          lVar13 = lVar13 + 1;
          lVar6 = lVar6 + 0x40;
        } while (iVar7 + 1 != (int)lVar13);
      }
      bVar2 = iVar14 < lVar16;
      lVar16 = lVar16 + -1;
    } while (bVar2);
  }
LAB_00280b43:
  if (iVar3 < iVar7) {
    lVar16 = lVar4 * 0x40 + lVar11 * 2;
    do {
      lVar13 = (long)iVar14;
      if (iVar14 <= iVar15) {
        do {
          if (iVar10 <= iVar8) {
            lVar6 = 0;
            do {
              if (*(short *)(*(long *)(p_Var1 + lVar13 * 8) + lVar16 + lVar6 * 2) != 0) {
                iVar3 = (int)lVar4;
                boxp->c1min = iVar3;
                goto LAB_00280bc0;
              }
              lVar6 = lVar6 + 1;
            } while ((iVar8 - iVar10) + 1 != (int)lVar6);
          }
          lVar13 = lVar13 + 1;
        } while (iVar15 + 1 != (int)lVar13);
      }
      lVar4 = lVar4 + 1;
      lVar16 = lVar16 + 0x40;
    } while (iVar7 + 1 != (int)lVar4);
  }
LAB_00280bc0:
  if (iVar3 < iVar7) {
    lVar4 = (long)iVar7 * 0x40 + lVar11 * 2;
    lVar16 = (long)iVar7;
    do {
      lVar13 = (long)iVar14;
      if (iVar14 <= iVar15) {
        do {
          if (iVar10 <= iVar8) {
            lVar6 = 0;
            do {
              if (*(short *)(*(long *)(p_Var1 + lVar13 * 8) + lVar4 + lVar6 * 2) != 0) {
                iVar7 = (int)lVar16;
                boxp->c1max = iVar7;
                goto LAB_00280c4a;
              }
              lVar6 = lVar6 + 1;
            } while ((iVar8 - iVar10) + 1 != (int)lVar6);
          }
          lVar13 = lVar13 + 1;
        } while (iVar15 + 1 != (int)lVar13);
      }
      lVar4 = lVar4 + -0x40;
      bVar2 = iVar3 < lVar16;
      lVar16 = lVar16 + -1;
    } while (bVar2);
  }
LAB_00280c4a:
  if (iVar10 < iVar8) {
    do {
      lVar4 = (long)iVar14;
      if (iVar14 <= iVar15) {
        do {
          if (iVar3 <= iVar7) {
            psVar5 = (short *)(*(long *)(p_Var1 + lVar4 * 8) + (long)iVar3 * 0x40 + lVar11 * 2);
            iVar12 = (iVar7 - iVar3) + 1;
            do {
              if (*psVar5 != 0) {
                iVar10 = (int)lVar11;
                boxp->c2min = iVar10;
                goto LAB_00280cc1;
              }
              psVar5 = psVar5 + 0x20;
              iVar12 = iVar12 + -1;
            } while (iVar12 != 0);
          }
          lVar4 = lVar4 + 1;
        } while (iVar15 + 1 != (int)lVar4);
      }
      lVar11 = lVar11 + 1;
    } while (iVar8 + 1 != (int)lVar11);
  }
LAB_00280cc1:
  if (iVar10 < iVar8) {
    lVar4 = (long)iVar8;
    do {
      lVar11 = (long)iVar14;
      if (iVar14 <= iVar15) {
        do {
          if (iVar3 <= iVar7) {
            psVar5 = (short *)(*(long *)(p_Var1 + lVar11 * 8) + (long)iVar3 * 0x40 + lVar4 * 2);
            iVar12 = (iVar7 - iVar3) + 1;
            do {
              if (*psVar5 != 0) {
                iVar8 = (int)lVar4;
                boxp->c2max = iVar8;
                goto LAB_00280d3d;
              }
              psVar5 = psVar5 + 0x20;
              iVar12 = iVar12 + -1;
            } while (iVar12 != 0);
          }
          lVar11 = lVar11 + 1;
        } while (iVar15 + 1 != (int)lVar11);
      }
      bVar2 = iVar10 < lVar4;
      lVar4 = lVar4 + -1;
    } while (bVar2);
  }
LAB_00280d3d:
  lVar4 = (long)((iVar15 - iVar14) * 0x10);
  lVar11 = (long)((iVar7 - iVar3) * 0xc);
  lVar16 = (long)((iVar8 - iVar10) * 8);
  boxp->volume = lVar16 * lVar16 + lVar4 * lVar4 + lVar11 * lVar11;
  if (iVar15 < iVar14) {
    lVar11 = 0;
  }
  else {
    lVar4 = (long)iVar14;
    lVar11 = 0;
    do {
      if (iVar3 <= iVar7) {
        lVar13 = *(long *)(p_Var1 + lVar4 * 8) + (long)iVar3 * 0x40 + (long)iVar10 * 2;
        lVar16 = (long)iVar3;
        do {
          if (iVar10 <= iVar8) {
            lVar6 = 0;
            do {
              lVar11 = (lVar11 + 1) - (ulong)(*(short *)(lVar13 + lVar6 * 2) == 0);
              lVar6 = lVar6 + 1;
            } while ((iVar8 - iVar10) + 1 != (int)lVar6);
          }
          lVar16 = lVar16 + 1;
          lVar13 = lVar13 + 0x40;
        } while (iVar7 + 1 != (int)lVar16);
      }
      lVar4 = lVar4 + 1;
    } while (iVar15 + 1 != (int)lVar4);
  }
  boxp->colorcount = lVar11;
  return;
}

Assistant:

LOCAL(void)
update_box (j_decompress_ptr cinfo, boxptr boxp)
/* Shrink the min/max bounds of a box to enclose only nonzero elements, */
/* and recompute its volume and population */
{
  my_cquantize_ptr cquantize = (my_cquantize_ptr) cinfo->cquantize;
  hist3d histogram = cquantize->histogram;
  histptr histp;
  int c0,c1,c2;
  int c0min,c0max,c1min,c1max,c2min,c2max;
  INT32 dist0,dist1,dist2;
  long ccount;
  
  c0min = boxp->c0min;  c0max = boxp->c0max;
  c1min = boxp->c1min;  c1max = boxp->c1max;
  c2min = boxp->c2min;  c2max = boxp->c2max;
  
  if (c0max > c0min)
    for (c0 = c0min; c0 <= c0max; c0++)
      for (c1 = c1min; c1 <= c1max; c1++) {
	histp = & histogram[c0][c1][c2min];
	for (c2 = c2min; c2 <= c2max; c2++)
	  if (*histp++ != 0) {
	    boxp->c0min = c0min = c0;
	    goto have_c0min;
	  }
      }
 have_c0min:
  if (c0max > c0min)
    for (c0 = c0max; c0 >= c0min; c0--)
      for (c1 = c1min; c1 <= c1max; c1++) {
	histp = & histogram[c0][c1][c2min];
	for (c2 = c2min; c2 <= c2max; c2++)
	  if (*histp++ != 0) {
	    boxp->c0max = c0max = c0;
	    goto have_c0max;
	  }
      }
 have_c0max:
  if (c1max > c1min)
    for (c1 = c1min; c1 <= c1max; c1++)
      for (c0 = c0min; c0 <= c0max; c0++) {
	histp = & histogram[c0][c1][c2min];
	for (c2 = c2min; c2 <= c2max; c2++)
	  if (*histp++ != 0) {
	    boxp->c1min = c1min = c1;
	    goto have_c1min;
	  }
      }
 have_c1min:
  if (c1max > c1min)
    for (c1 = c1max; c1 >= c1min; c1--)
      for (c0 = c0min; c0 <= c0max; c0++) {
	histp = & histogram[c0][c1][c2min];
	for (c2 = c2min; c2 <= c2max; c2++)
	  if (*histp++ != 0) {
	    boxp->c1max = c1max = c1;
	    goto have_c1max;
	  }
      }
 have_c1max:
  if (c2max > c2min)
    for (c2 = c2min; c2 <= c2max; c2++)
      for (c0 = c0min; c0 <= c0max; c0++) {
	histp = & histogram[c0][c1min][c2];
	for (c1 = c1min; c1 <= c1max; c1++, histp += HIST_C2_ELEMS)
	  if (*histp != 0) {
	    boxp->c2min = c2min = c2;
	    goto have_c2min;
	  }
      }
 have_c2min:
  if (c2max > c2min)
    for (c2 = c2max; c2 >= c2min; c2--)
      for (c0 = c0min; c0 <= c0max; c0++) {
	histp = & histogram[c0][c1min][c2];
	for (c1 = c1min; c1 <= c1max; c1++, histp += HIST_C2_ELEMS)
	  if (*histp != 0) {
	    boxp->c2max = c2max = c2;
	    goto have_c2max;
	  }
      }
 have_c2max:

  /* Update box volume.
   * We use 2-norm rather than real volume here; this biases the method
   * against making long narrow boxes, and it has the side benefit that
   * a box is splittable iff norm > 0.
   * Since the differences are expressed in histogram-cell units,
   * we have to shift back to JSAMPLE units to get consistent distances;
   * after which, we scale according to the selected distance scale factors.
   */
  dist0 = ((c0max - c0min) << C0_SHIFT) * C0_SCALE;
  dist1 = ((c1max - c1min) << C1_SHIFT) * C1_SCALE;
  dist2 = ((c2max - c2min) << C2_SHIFT) * C2_SCALE;
  boxp->volume = dist0*dist0 + dist1*dist1 + dist2*dist2;
  
  /* Now scan remaining volume of box and compute population */
  ccount = 0;
  for (c0 = c0min; c0 <= c0max; c0++)
    for (c1 = c1min; c1 <= c1max; c1++) {
      histp = & histogram[c0][c1][c2min];
      for (c2 = c2min; c2 <= c2max; c2++, histp++)
	if (*histp != 0) {
	  ccount++;
	}
    }
  boxp->colorcount = ccount;
}